

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_4_5_core.cpp
# Opt level: O0

bool __thiscall
QOpenGLFunctions_4_5_Core::initializeOpenGLFunctions(QOpenGLFunctions_4_5_Core *this)

{
  bool bVar1;
  QAbstractOpenGLFunctions *this_00;
  QOpenGLContext *pQVar2;
  QAbstractOpenGLFunctions *pQVar3;
  QOpenGLVersionFunctionsBackend *pQVar4;
  long in_RDI;
  QOpenGLVersionFunctionsBackend *d;
  QOpenGLContext *context;
  QOpenGLContext *in_stack_ffffffffffffff48;
  Version v;
  QAbstractOpenGLFunctions *in_stack_ffffffffffffff50;
  bool local_1;
  
  bVar1 = QAbstractOpenGLFunctions::isInitialized(in_stack_ffffffffffffff50);
  if (bVar1) {
    local_1 = true;
  }
  else {
    this_00 = (QAbstractOpenGLFunctions *)QOpenGLContext::currentContext();
    pQVar2 = QAbstractOpenGLFunctions::owningContext(in_stack_ffffffffffffff50);
    if ((((pQVar2 != (QOpenGLContext *)0x0) &&
         (pQVar3 = (QAbstractOpenGLFunctions *)
                   QAbstractOpenGLFunctions::owningContext(in_stack_ffffffffffffff50),
         pQVar3 == this_00)) ||
        (pQVar2 = QAbstractOpenGLFunctions::owningContext(in_stack_ffffffffffffff50),
        pQVar2 == (QOpenGLContext *)0x0)) &&
       (bVar1 = isContextCompatible(in_stack_ffffffffffffff48), bVar1)) {
      pQVar3 = this_00;
      QOpenGLFunctions_1_0_CoreBackend::versionStatus();
      v = (Version)((ulong)pQVar3 >> 0x20);
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)in_stack_ffffffffffffff50,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x10) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c6ba7);
      QOpenGLFunctions_1_1_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x18) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c6bf5);
      QOpenGLFunctions_1_2_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x20) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c6c43);
      QOpenGLFunctions_1_3_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x28) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c6c91);
      QOpenGLFunctions_1_4_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x30) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c6cdf);
      QOpenGLFunctions_1_5_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x38) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c6d2d);
      QOpenGLFunctions_2_0_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x40) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c6d7b);
      QOpenGLFunctions_2_1_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x48) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c6dc9);
      QOpenGLFunctions_3_0_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x50) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c6e17);
      QOpenGLFunctions_3_1_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x58) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c6e65);
      QOpenGLFunctions_3_2_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x60) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c6eb3);
      QOpenGLFunctions_3_3_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x68) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c6f01);
      QOpenGLFunctions_4_0_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x70) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c6f4f);
      QOpenGLFunctions_4_1_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x78) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c6f9d);
      QOpenGLFunctions_4_2_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x80) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c6fee);
      QOpenGLFunctions_4_3_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x88) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c703f);
      QOpenGLFunctions_4_4_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x90) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c7096);
      QOpenGLFunctions_4_5_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x98) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1c70ed);
      QAbstractOpenGLFunctions::initializeOpenGLFunctions(this_00);
      in_stack_ffffffffffffff50 = this_00;
    }
    local_1 = QAbstractOpenGLFunctions::isInitialized(in_stack_ffffffffffffff50);
  }
  return local_1;
}

Assistant:

bool QOpenGLFunctions_4_5_Core::initializeOpenGLFunctions()
{
    if ( isInitialized() )
        return true;

    QOpenGLContext* context = QOpenGLContext::currentContext();

    // If owned by a context object make sure it is current.
    // Also check that current context is capable of resolving all needed functions
    if (((owningContext() && owningContext() == context) || !owningContext())
        && QOpenGLFunctions_4_5_Core::isContextCompatible(context))
    {
        // Associate with private implementation, creating if necessary
        // Function pointers in the backends are resolved at creation time
        QOpenGLVersionFunctionsBackend* d = nullptr;
        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_0_CoreBackend::versionStatus());
        d_1_0_Core = static_cast<QOpenGLFunctions_1_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_1_CoreBackend::versionStatus());
        d_1_1_Core = static_cast<QOpenGLFunctions_1_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_2_CoreBackend::versionStatus());
        d_1_2_Core = static_cast<QOpenGLFunctions_1_2_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_3_CoreBackend::versionStatus());
        d_1_3_Core = static_cast<QOpenGLFunctions_1_3_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_4_CoreBackend::versionStatus());
        d_1_4_Core = static_cast<QOpenGLFunctions_1_4_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_5_CoreBackend::versionStatus());
        d_1_5_Core = static_cast<QOpenGLFunctions_1_5_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_2_0_CoreBackend::versionStatus());
        d_2_0_Core = static_cast<QOpenGLFunctions_2_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_2_1_CoreBackend::versionStatus());
        d_2_1_Core = static_cast<QOpenGLFunctions_2_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_3_0_CoreBackend::versionStatus());
        d_3_0_Core = static_cast<QOpenGLFunctions_3_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_3_1_CoreBackend::versionStatus());
        d_3_1_Core = static_cast<QOpenGLFunctions_3_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_3_2_CoreBackend::versionStatus());
        d_3_2_Core = static_cast<QOpenGLFunctions_3_2_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_3_3_CoreBackend::versionStatus());
        d_3_3_Core = static_cast<QOpenGLFunctions_3_3_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_4_0_CoreBackend::versionStatus());
        d_4_0_Core = static_cast<QOpenGLFunctions_4_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_4_1_CoreBackend::versionStatus());
        d_4_1_Core = static_cast<QOpenGLFunctions_4_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_4_2_CoreBackend::versionStatus());
        d_4_2_Core = static_cast<QOpenGLFunctions_4_2_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_4_3_CoreBackend::versionStatus());
        d_4_3_Core = static_cast<QOpenGLFunctions_4_3_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_4_4_CoreBackend::versionStatus());
        d_4_4_Core = static_cast<QOpenGLFunctions_4_4_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_4_5_CoreBackend::versionStatus());
        d_4_5_Core = static_cast<QOpenGLFunctions_4_5_CoreBackend*>(d);
        d->refs.ref();

        QAbstractOpenGLFunctions::initializeOpenGLFunctions();
    }
    return isInitialized();
}